

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

bool __thiscall
branch_and_reduce_algorithm::folded_vertices_exist(branch_and_reduce_algorithm *this)

{
  bool bVar1;
  __shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  reference piVar3;
  iterator iStack_60;
  int i_1;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_34;
  undefined1 local_30 [4];
  int i;
  vector<int,_std::allocator<int>_> x2;
  branch_and_reduce_algorithm *this_local;
  
  x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,&this->x);
  local_34 = this->modifiedN;
  while (local_34 = local_34 + -1, -1 < local_34) {
    this_00 = (__shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>::
              operator[](&this->modifieds,(long)local_34);
    peVar2 = std::__shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_00);
    (*peVar2->_vptr_modified[3])(peVar2,local_30);
  }
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_60 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_30);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffa0);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_0012c39a:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30)
      ;
      return this_local._7_1_;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    if (*piVar3 == 2) {
      this_local._7_1_ = true;
      goto LAB_0012c39a;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

bool branch_and_reduce_algorithm::folded_vertices_exist() const
{

    std::vector<int> x2(x);

    for (int i = modifiedN - 1; i >= 0; i--)
    {
        modifieds[i]->reverse(x2);
    }

    for (int const i : x2)
    {
        if (i == 2)
            return true;
    }

    return false;
}